

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-link.h
# Opt level: O1

void __thiscall mp::pre::Many2ManyLink::AddEntry(Many2ManyLink *this,LinkEntry be)

{
  iterator *piVar1;
  _Elt_pointer ppVar2;
  _Elt_pointer ppVar3;
  _Map_pointer pppVar4;
  long lVar5;
  _Elt_pointer ppVar6;
  LinkRange br;
  
  ppVar2 = (this->entries_).
           super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar2 != (this->entries_).
                super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ppVar3 = (this->entries_).
             super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVar6 = ppVar2;
    if (ppVar2 == ppVar3) {
      ppVar6 = (this->entries_).
               super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    if (((ppVar6[-1].first.pvn_ == be.first.pvn_) &&
        (ppVar6[-1].first.ir_.beg_ == be.first.ir_.beg_)) &&
       (ppVar6[-1].first.ir_.end_ == be.first.ir_.end_)) {
      ppVar6 = ppVar2;
      if (ppVar2 == ppVar3) {
        ppVar6 = (this->entries_).
                 super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if ((ppVar6[-1].second.pvn_ == be.second.pvn_) &&
         (ppVar6[-1].second.ir_.end_ == be.second.ir_.beg_)) {
        ppVar6[-1].second.ir_.end_ = be.second.ir_.end_;
        return;
      }
    }
    ppVar6 = ppVar2;
    if (ppVar2 == ppVar3) {
      ppVar6 = (this->entries_).
               super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    if (((ppVar6[-1].second.pvn_ == be.second.pvn_) &&
        (ppVar6[-1].second.ir_.beg_ == be.second.ir_.beg_)) &&
       (ppVar6[-1].second.ir_.end_ == be.second.ir_.end_)) {
      ppVar6 = ppVar2;
      if (ppVar2 == ppVar3) {
        ppVar6 = (this->entries_).
                 super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if ((ppVar6[-1].first.pvn_ == be.first.pvn_) &&
         (ppVar6[-1].first.ir_.end_ == be.first.ir_.beg_)) {
        ppVar6[-1].first.ir_.end_ = be.first.ir_.end_;
        return;
      }
    }
  }
  if (ppVar2 == (this->entries_).
                super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::pair<mp::pre::NodeRange,mp::pre::NodeRange>,std::allocator<std::pair<mp::pre::NodeRange,mp::pre::NodeRange>>>
    ::_M_push_back_aux<std::pair<mp::pre::NodeRange,mp::pre::NodeRange>const&>
              ((deque<std::pair<mp::pre::NodeRange,mp::pre::NodeRange>,std::allocator<std::pair<mp::pre::NodeRange,mp::pre::NodeRange>>>
                *)&this->entries_,&be);
  }
  else {
    (ppVar2->second).pvn_ = be.second.pvn_;
    (ppVar2->second).ir_ = be.second.ir_;
    (ppVar2->first).pvn_ = be.first.pvn_;
    (ppVar2->first).ir_ = be.first.ir_;
    piVar1 = &(this->entries_).
              super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->if_consider_for_last_link_,false);
  pppVar4 = (this->entries_).
            super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar5 = ((ulong)((long)(this->entries_).
                         super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)(this->entries_).
                        super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
          ((ulong)((long)(this->entries_).
                         super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(this->entries_).
                        super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
          ((((ulong)((long)pppVar4 -
                    (long)(this->entries_).
                          super__Deque_base<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>,_std::allocator<std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(pppVar4 == (_Map_pointer)0x0)) * 0x10;
  br.ir_ = (LinkIndexRange)((ulong)((int)lVar5 - 1) | lVar5 << 0x20);
  br.b_ = &this->super_BasicLink;
  ValuePresolverImpl::Add(&((this->super_BasicLink).value_presolver_)->super_ValuePresolverImpl,br);
  return;
}

Assistant:

void AddEntry(LinkEntry be) {
    if (entries_.empty() ||
        !(
          (entries_.back().first==be.first   // same sources
           && entries_.back().second.TryExtendBy(be.second))
          ||
          (entries_.back().second==be.second // same targets
           && entries_.back().first.TryExtendBy(be.first))
          )) {
      entries_.push_back(be);             // Add new entry
      if_consider_for_last_link_.push_back(false);
      RegisterLinkIndex(entries_.size()-1);
    }
  }